

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessingValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)2003>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  bool bVar1;
  SoundAnalysisPreprocessingTypeCase SVar2;
  int iVar3;
  ArrayFeatureType_ArrayDataType AVar4;
  MLArrayDataType MVar5;
  CoreML *pCVar6;
  FeatureDescription *pFVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  RepeatedField<long> *pRVar10;
  long *plVar11;
  ostream *poVar12;
  void *pvVar13;
  char *pcVar14;
  string *psVar15;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_8b1;
  string local_8b0;
  string local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  stringstream local_850 [8];
  stringstream out_3;
  ostream local_840 [376];
  undefined1 local_6c8 [8];
  FeatureType outputType;
  stringstream local_680 [8];
  stringstream out_2;
  ostream local_670 [376];
  undefined1 local_4f8 [8];
  RepeatedField<long> arrayOutputShape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  stringstream local_4a8 [8];
  stringstream out_1;
  ostream local_498 [376];
  undefined1 local_320 [8];
  FeatureType inputType;
  stringstream local_2d8 [8];
  stringstream out;
  ostream local_2c8 [376];
  undefined1 local_150 [8];
  RepeatedField<long> arrayInputShape;
  SoundAnalysisPreprocessing *soundAnalysisPreprocessing;
  iterator local_130;
  size_type local_128;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_120;
  Result local_108;
  int local_dc;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_d5;
  TypeCase local_d4;
  iterator local_d0;
  size_type local_c8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  Result local_a8;
  undefined1 local_80 [8];
  Result result;
  allocator<char> local_41;
  string local_40;
  ModelDescription *local_20;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_20 = Specification::Model::description(format);
  bVar1 = Specification::Model::has_soundanalysispreprocessing((Model *)interface);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Model not a sound analysis preprocessing.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    return __return_storage_ptr__;
  }
  Result::Result((Result *)local_80);
  pCVar6 = (CoreML *)Specification::ModelDescription::input(local_20);
  local_d4 = kMultiArrayType;
  local_d0 = &local_d4;
  local_c8 = 1;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_d5);
  __l_00._M_len = local_c8;
  __l_00._M_array = local_d0;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&local_c0,__l_00,&local_d5);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            (&local_a8,pCVar6,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
             (int)&local_c0,in_R8);
  Result::operator=((Result *)local_80,&local_a8);
  Result::~Result(&local_a8);
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector(&local_c0);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_d5);
  bVar1 = Result::good((Result *)local_80);
  if (bVar1) {
    pCVar6 = (CoreML *)Specification::ModelDescription::output(local_20);
    soundAnalysisPreprocessing._4_4_ = 5;
    local_130 = (iterator)((long)&soundAnalysisPreprocessing + 4);
    local_128 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator
              ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
               ((long)&soundAnalysisPreprocessing + 3));
    __l._M_len = local_128;
    __l._M_array = local_130;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_120,__l,
             (allocator<CoreML::Specification::FeatureType::TypeCase> *)
             ((long)&soundAnalysisPreprocessing + 3));
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_108,pCVar6,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
               (int)&local_120,in_R8);
    Result::operator=((Result *)local_80,&local_108);
    Result::~Result(&local_108);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_120);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
              ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
               ((long)&soundAnalysisPreprocessing + 3));
    bVar1 = Result::good((Result *)local_80);
    if (bVar1) {
      arrayInputShape.arena_or_elements_ =
           Specification::Model::soundanalysispreprocessing((Model *)interface);
      SVar2 = Specification::CoreMLModels::SoundAnalysisPreprocessing::
              SoundAnalysisPreprocessingType_case
                        ((SoundAnalysisPreprocessing *)arrayInputShape.arena_or_elements_);
      if (SVar2 == SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8b0,"Type for sound analysis preprocessing not set",&local_8b1);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_8b0);
        std::__cxx11::string::~string((string *)&local_8b0);
        std::allocator<char>::~allocator(&local_8b1);
        local_dc = 1;
      }
      else {
        if (SVar2 == kVggish) {
          pFVar7 = Specification::ModelDescription::input(local_20,0);
          pFVar8 = Specification::FeatureDescription::type(pFVar7);
          pAVar9 = Specification::FeatureType::multiarraytype(pFVar8);
          pRVar10 = Specification::ArrayFeatureType::shape(pAVar9);
          google::protobuf::RepeatedField<long>::RepeatedField
                    ((RepeatedField<long> *)local_150,pRVar10);
          iVar3 = google::protobuf::RepeatedField<long>::size((RepeatedField<long> *)local_150);
          if ((iVar3 == 1) &&
             (plVar11 = google::protobuf::RepeatedField<long>::operator[]
                                  ((RepeatedField<long> *)local_150,0), *plVar11 == 0x3cf0)) {
            pFVar7 = Specification::ModelDescription::input(local_20,0);
            pFVar8 = Specification::FeatureDescription::type(pFVar7);
            Specification::FeatureType::FeatureType((FeatureType *)local_320,pFVar8);
            pAVar9 = Specification::FeatureType::multiarraytype((FeatureType *)local_320);
            AVar4 = Specification::ArrayFeatureType::datatype(pAVar9);
            if (AVar4 == ArrayFeatureType_ArrayDataType_FLOAT32) {
              pFVar7 = Specification::ModelDescription::output(local_20,0);
              pFVar8 = Specification::FeatureDescription::type(pFVar7);
              pAVar9 = Specification::FeatureType::multiarraytype(pFVar8);
              pRVar10 = Specification::ArrayFeatureType::shape(pAVar9);
              google::protobuf::RepeatedField<long>::RepeatedField
                        ((RepeatedField<long> *)local_4f8,pRVar10);
              iVar3 = google::protobuf::RepeatedField<long>::size((RepeatedField<long> *)local_4f8);
              if ((((iVar3 == 3) &&
                   (plVar11 = google::protobuf::RepeatedField<long>::operator[]
                                        ((RepeatedField<long> *)local_4f8,0), *plVar11 == 1)) &&
                  (plVar11 = google::protobuf::RepeatedField<long>::operator[]
                                       ((RepeatedField<long> *)local_4f8,1), *plVar11 == 0x60)) &&
                 (plVar11 = google::protobuf::RepeatedField<long>::operator[]
                                      ((RepeatedField<long> *)local_4f8,2), *plVar11 == 0x40)) {
                pFVar7 = Specification::ModelDescription::output(local_20,0);
                pFVar8 = Specification::FeatureDescription::type(pFVar7);
                Specification::FeatureType::FeatureType((FeatureType *)local_6c8,pFVar8);
                pAVar9 = Specification::FeatureType::multiarraytype((FeatureType *)local_6c8);
                AVar4 = Specification::ArrayFeatureType::datatype(pAVar9);
                if (AVar4 == ArrayFeatureType_ArrayDataType_FLOAT32) {
                  local_dc = 2;
                }
                else {
                  std::__cxx11::stringstream::stringstream(local_850);
                  poVar12 = std::operator<<(local_840,"Unsupported array type \"");
                  pAVar9 = Specification::FeatureType::multiarraytype((FeatureType *)local_6c8);
                  MVar5 = Specification::ArrayFeatureType::datatype(pAVar9);
                  pcVar14 = MLArrayDataType_Name(MVar5);
                  poVar12 = std::operator<<(poVar12,pcVar14);
                  poVar12 = std::operator<<(poVar12,"\" for feature \"");
                  pFVar7 = Specification::ModelDescription::input(local_20,0);
                  psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFVar7);
                  std::operator+(&local_870,psVar15,"\". ");
                  poVar12 = std::operator<<(poVar12,(string *)&local_870);
                  poVar12 = std::operator<<(poVar12,"Should be of: ");
                  pcVar14 = MLArrayDataType_Name(MLArrayDataTypeFLOAT32);
                  poVar12 = std::operator<<(poVar12,pcVar14);
                  poVar12 = std::operator<<(poVar12,".");
                  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
                  std::__cxx11::string::~string((string *)&local_870);
                  std::__cxx11::stringstream::str();
                  Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                                 &local_890);
                  std::__cxx11::string::~string((string *)&local_890);
                  local_dc = 1;
                  std::__cxx11::stringstream::~stringstream(local_850);
                }
                Specification::FeatureType::~FeatureType((FeatureType *)local_6c8);
              }
              else {
                std::__cxx11::stringstream::stringstream(local_680);
                poVar12 = std::operator<<(local_670,
                                          "Incorrect output shape, should be 3-dimension, of size: "
                                         );
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,1);
                poVar12 = std::operator<<(poVar12,"x");
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x60);
                poVar12 = std::operator<<(poVar12,"x");
                pvVar13 = (void *)std::ostream::operator<<(poVar12,0x40);
                std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
                std::__cxx11::stringstream::str();
                Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                               (string *)&outputType._cached_size_);
                std::__cxx11::string::~string((string *)&outputType._cached_size_);
                local_dc = 1;
                std::__cxx11::stringstream::~stringstream(local_680);
              }
              google::protobuf::RepeatedField<long>::~RepeatedField
                        ((RepeatedField<long> *)local_4f8);
            }
            else {
              std::__cxx11::stringstream::stringstream(local_4a8);
              poVar12 = std::operator<<(local_498,"Unsupported array type \"");
              pAVar9 = Specification::FeatureType::multiarraytype((FeatureType *)local_320);
              MVar5 = Specification::ArrayFeatureType::datatype(pAVar9);
              pcVar14 = MLArrayDataType_Name(MVar5);
              poVar12 = std::operator<<(poVar12,pcVar14);
              poVar12 = std::operator<<(poVar12,"\" for feature \"");
              pFVar7 = Specification::ModelDescription::input(local_20,0);
              psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFVar7);
              std::operator+(&local_4c8,psVar15,"\". ");
              poVar12 = std::operator<<(poVar12,(string *)&local_4c8);
              poVar12 = std::operator<<(poVar12,"Should be of: ");
              pcVar14 = MLArrayDataType_Name(MLArrayDataTypeFLOAT32);
              poVar12 = std::operator<<(poVar12,pcVar14);
              poVar12 = std::operator<<(poVar12,".");
              std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&local_4c8);
              std::__cxx11::stringstream::str();
              Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                             (string *)&arrayOutputShape.arena_or_elements_);
              std::__cxx11::string::~string((string *)&arrayOutputShape.arena_or_elements_);
              local_dc = 1;
              std::__cxx11::stringstream::~stringstream(local_4a8);
            }
            Specification::FeatureType::~FeatureType((FeatureType *)local_320);
          }
          else {
            std::__cxx11::stringstream::stringstream(local_2d8);
            poVar12 = std::operator<<(local_2c8,
                                      "Incorrect input shape, should be 1-dimension, of length: ");
            pvVar13 = (void *)std::ostream::operator<<(poVar12,0x3cf0);
            std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
            std::__cxx11::stringstream::str();
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                           (string *)&inputType._cached_size_);
            std::__cxx11::string::~string((string *)&inputType._cached_size_);
            local_dc = 1;
            std::__cxx11::stringstream::~stringstream(local_2d8);
          }
          google::protobuf::RepeatedField<long>::~RepeatedField((RepeatedField<long> *)local_150);
          if (local_dc != 2) goto LAB_004736eb;
        }
        Result::Result(__return_storage_ptr__,(Result *)local_80);
        local_dc = 1;
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_80);
      local_dc = 1;
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_80);
    local_dc = 1;
  }
LAB_004736eb:
  Result::~Result((Result *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_soundAnalysisPreprocessing>(const Specification::Model &format) {
        const auto &interface = format.description();
        
        // make sure model is a sound analysis preprocessing
        if (!format.has_soundanalysispreprocessing()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a sound analysis preprocessing.");
        }
        
        Result result;
        
        // validate the inputs: only one input with multiarray type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

        // validate the outputs: only one output with multiarray type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

        // other validate logics here
        const auto &soundAnalysisPreprocessing = format.soundanalysispreprocessing();
        switch (soundAnalysisPreprocessing.SoundAnalysisPreprocessingType_case()) {
            case Specification::CoreMLModels::SoundAnalysisPreprocessing::kVggish:
            {
                // validate input shape for VGGish preprocessing
                auto arrayInputShape = interface.input(0).type().multiarraytype().shape();
                if (arrayInputShape.size() != 1 || arrayInputShape[0] != FRONTEND_PROCESSING_INPUT_LENGTH) {
                    std::stringstream out;
                    out << "Incorrect input shape, should be 1-dimension, of length: "<<FRONTEND_PROCESSING_INPUT_LENGTH<<std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate input data type
                auto inputType = interface.input(0).type();
                if (inputType.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                    std::stringstream out;
                    out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(inputType.multiarraytype().datatype()))
                    << "\" for feature \"" << interface.input(0).name() + "\". "
                    << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(Specification::ArrayFeatureType_ArrayDataType_FLOAT32))
                    << "." << std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate output shape
                auto arrayOutputShape = interface.output(0).type().multiarraytype().shape();
                if (arrayOutputShape.size() != 3 || arrayOutputShape[0] != 1
                    || arrayOutputShape[1] != FRONTEND_PROCESSING_OUTPUT_NUM_FRAMES
                    || arrayOutputShape[2] != FRONTEND_PROCESSING_OUTPUT_NUM_BANDS) {
                    std::stringstream out;
                    out << "Incorrect output shape, should be 3-dimension, of size: "<<1<<"x"<<FRONTEND_PROCESSING_OUTPUT_NUM_FRAMES<<"x"<<FRONTEND_PROCESSING_OUTPUT_NUM_BANDS<<std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate output data type
                auto outputType = interface.output(0).type();
                if (outputType.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                    std::stringstream out;
                    out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(outputType.multiarraytype().datatype()))
                    << "\" for feature \"" << interface.input(0).name() + "\". "
                    << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(Specification::ArrayFeatureType_ArrayDataType_FLOAT32))
                    << "." << std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                break;
            }
            case Specification::CoreMLModels::SoundAnalysisPreprocessing::SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Type for sound analysis preprocessing not set");
        }
        
        return result;
    }